

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawNegativeViewportHeightTests.cpp
# Opt level: O2

TestCaseGroup * vkt::Draw::createNegativeViewportHeightTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"negative_viewport_height",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Negative viewport height (VK_KHR_maintenance1)",&local_4a);
  pTVar1 = createTestGroup(testCtx,&local_28,&local_48,anon_unknown_0::populateTestGroup);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup*	createNegativeViewportHeightTests (tcu::TestContext& testCtx)
{
	return createTestGroup(testCtx, "negative_viewport_height", "Negative viewport height (VK_KHR_maintenance1)", populateTestGroup);
}